

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall E64::hud_t::redraw(hud_t *this)

{
  bool bVar1;
  blitter_ic *in_RDI;
  blit_t *in_stack_ffffffffffffffe8;
  blitter_ic *this_00;
  
  this_00 = in_RDI;
  blitter_ic::clear_framebuffer(*(blitter_ic **)&in_RDI->blitter_context_6);
  if ((in_RDI->pixels_per_scanline & 1) != 0) {
    blitter_ic::add_operation_draw_blit(in_RDI,in_stack_ffffffffffffffe8);
  }
  if (in_RDI->scanlines != 0) {
    blitter_ic::add_operation_draw_blit(in_RDI,in_stack_ffffffffffffffe8);
    in_RDI->scanlines = in_RDI->scanlines - 1;
  }
  do {
    bVar1 = blitter_ic::run_next_operation(this_00);
  } while (bVar1);
  return;
}

Assistant:

void E64::hud_t::redraw()
{
	blitter->clear_framebuffer();
	if (stats_visible) blitter->add_operation_draw_blit(&blitter->blit[0]);
	if (notify_frame_counter != 0) {
		blitter->add_operation_draw_blit(&blitter->blit[1]);
		notify_frame_counter--;
	}
	while (blitter->run_next_operation()) {}
}